

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O1

void absl::lts_20250127::crc_internal::CRCImpl::FillWordTable
               (uint32_t poly,uint32_t last,int word_size,Uint32By256 *t)

{
  bool bVar1;
  ulong uVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  Uint32By256 *pauVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  if (word_size != 0) {
    uVar2 = 0;
    pauVar5 = t;
    do {
      t[uVar2][0] = 0;
      uVar7 = 0x80;
      do {
        if (uVar7 == 0x80 && uVar2 == 0) {
          t[uVar2][0x80] = last;
        }
        else {
          puVar4 = t[uVar2] + uVar7 * 2;
          if (uVar7 == 0x80) {
            puVar4 = (t + uVar2)[-1] + 1;
          }
          uVar3 = *puVar4 >> 1;
          if ((*puVar4 & 1) != 0) {
            uVar3 = uVar3 ^ poly;
          }
          t[uVar2][uVar7] = uVar3;
        }
        bVar1 = 1 < uVar7;
        uVar7 = uVar7 >> 1;
      } while (bVar1);
      uVar6 = 2;
      do {
        lVar8 = (long)(int)uVar6;
        uVar7 = (int)uVar6 * 2;
        uVar6 = (ulong)uVar7;
        lVar9 = 1;
        do {
          (*pauVar5)[lVar8 + lVar9] = (*pauVar5)[lVar9] ^ t[uVar2][lVar8];
          lVar9 = lVar9 + 1;
        } while (uVar6 - lVar8 != lVar9);
      } while (uVar7 != 0x100);
      uVar2 = uVar2 + 1;
      pauVar5 = pauVar5 + 1;
    } while (uVar2 != (uint)word_size);
  }
  return;
}

Assistant:

void CRCImpl::FillWordTable(uint32_t poly, uint32_t last, int word_size,
                            Uint32By256* t) {
  for (int j = 0; j != word_size; j++) {  // for each byte of extension....
    t[j][0] = 0;                          // a zero has no effect
    for (int i = 128; i != 0; i >>= 1) {  // fill in entries for powers of 2
      if (j == 0 && i == 128) {
        t[j][i] = last;  // top bit in last byte is given
      } else {
        // each successive power of two is derived from the previous
        // one, either in this table, or the last table
        uint32_t pred;
        if (i == 128) {
          pred = t[j - 1][1];
        } else {
          pred = t[j][i << 1];
        }
        // Advance the CRC by one bit (multiply by X, and take remainder
        // through one step of polynomial long division)
        if (pred & 1) {
          t[j][i] = (pred >> 1) ^ poly;
        } else {
          t[j][i] = pred >> 1;
        }
      }
    }
    // CRCs have the property that CRC(a xor b) == CRC(a) xor CRC(b)
    // so we can make all the tables for non-powers of two by
    // xoring previously created entries.
    for (int i = 2; i != 256; i <<= 1) {
      for (int k = i + 1; k != (i << 1); k++) {
        t[j][k] = t[j][i] ^ t[j][k - i];
      }
    }
  }
}